

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev3dev.cpp
# Opt level: O0

bool __thiscall ev3dev::button::pressed(button *this)

{
  int __fd;
  element_type *this_00;
  size_type sVar1;
  unsigned_long *puVar2;
  const_reference pvVar3;
  __shared_ptr_access<ev3dev::button::file_descriptor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_RDI;
  
  this_00 = std::
            __shared_ptr_access<ev3dev::button::file_descriptor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator*(in_RDI);
  __fd = file_descriptor::operator_cast_to_int(this_00);
  sVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x28));
  puVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x127aea);
  ioctl(__fd,sVar1 << 0x10 | 0x80004518,puVar2);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x28),
                      (long)(*(int *)(in_RDI + 0x20) / 0x40));
  return (*pvVar3 & (long)(1 << ((byte)((long)*(int *)(in_RDI + 0x20) % 0x40) & 0x1f))) != 0;
}

Assistant:

bool button::pressed() const {
#ifndef NO_LINUX_HEADERS
    if (ioctl(*_fd, EVIOCGKEY(_buf.size()), _buf.data()) < 0) {
        // handle error
    }
#endif
    return (_buf[_bit / bits_per_long] & 1 << (_bit % bits_per_long));
}